

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void RpcInterruptionPoint(void)

{
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)g_rpc_running._M_base._M_i & 1) == 0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Shutting down","");
    JSONRPCError(__return_storage_ptr__,-9,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RpcInterruptionPoint()
{
    if (!IsRPCRunning()) throw JSONRPCError(RPC_CLIENT_NOT_CONNECTED, "Shutting down");
}